

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

ostream * __thiscall bhf::ads::RegistryEntry::Write(RegistryEntry *this,ostream *os)

{
  _Setfill<char> _Var1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  mapped_type *pmVar5;
  uchar *puVar6;
  const_reference pvVar7;
  mapped_type *pmVar8;
  long lVar9;
  size_type sVar10;
  byte *pbVar11;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  char local_6d;
  int local_6c;
  uchar *local_68;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  dataIt;
  int lineWrap;
  ulong local_48;
  size_t i;
  uint32_t val;
  uchar *dataBegin;
  string *prefix;
  size_t currentPos;
  ostream *os_local;
  RegistryEntry *this_local;
  
  if (this->keyLen == 0) {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->buffer,0)
    ;
    if (*pvVar7 == '\0') {
      std::operator<<(os,'@');
      prefix = (string *)0x1;
    }
    else {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer);
      prefix = (string *)WriteEscaped(os,puVar6,true);
    }
    pmVar8 = std::
             map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
             ::at((map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
                   *)g_RegTypeMapping,&this->type);
    std::operator<<(os,(string *)pmVar8);
    lVar9 = std::__cxx11::string::length();
    prefix = prefix + lVar9;
    if (this->type == 1) {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
      WriteEscaped(os,puVar6 + (sVar10 - this->dataLen),false);
    }
    else if (this->type == 4) {
      i._4_4_ = 0;
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
      for (local_48 = sVar10 - 4;
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer),
          local_48 < sVar10; local_48 = local_48 + 1) {
        pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&this->buffer,local_48);
        i._4_4_ = (uint)*pbVar11 + i._4_4_ * 0x100;
      }
      poVar4 = (ostream *)std::ostream::operator<<(os,std::hex);
      _Var3 = std::setw(8);
      poVar4 = std::operator<<(poVar4,_Var3);
      _Var1 = std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,_Var1._M_c);
      std::ostream::operator<<(poVar4,i._4_4_);
    }
    else if (this->dataLen != 0) {
      dataIt._M_current._4_4_ = 0x4c;
      local_68 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                    (&this->buffer);
      local_60 = std::
                 prev<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             )local_68,this->dataLen);
      poVar4 = (ostream *)std::ostream::operator<<(os,std::hex);
      local_6c = (int)std::setw(2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_6c);
      local_6d = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4);
      local_78 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator++(&local_60,0);
      pbVar11 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator*(&local_78);
      std::ostream::operator<<(poVar4,(uint)*pbVar11);
      while( true ) {
        local_80._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                (&this->buffer);
        bVar2 = __gnu_cxx::operator!=(&local_60,&local_80);
        if (!bVar2) break;
        std::operator<<(os,',');
        prefix = prefix + 1;
        if ((string *)0x4b < prefix) {
          std::operator<<(os,"\\\n  ");
          prefix = (string *)0x2;
        }
        poVar4 = (ostream *)std::ostream::operator<<(os,std::hex);
        _Var3 = std::setw(2);
        poVar4 = std::operator<<(poVar4,_Var3);
        _Var1 = std::setfill<char>('0');
        poVar4 = std::operator<<(poVar4,_Var1._M_c);
        pbVar11 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator*(&local_60);
        std::ostream::operator<<(poVar4,(uint)*pbVar11);
        prefix = prefix + 2;
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&local_60,0);
      }
    }
    this_local = (RegistryEntry *)std::operator<<(os,'\n');
  }
  else {
    poVar4 = std::operator<<(os,"\n[");
    pmVar5 = std::
             map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)g_HiveMapping_abi_cxx11_,&this->hive);
    poVar4 = std::operator<<(poVar4,(string *)pmVar5);
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer);
    poVar4 = std::operator<<(poVar4,(char *)puVar6);
    this_local = (RegistryEntry *)std::operator<<(poVar4,"]\n");
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& RegistryEntry::Write(std::ostream& os) const
{
    if (keyLen) {
        // RegistryEntry is a registry key, which has no value and is placed in brackets in its own line
        return os << "\n[" << g_HiveMapping.at(hive) << reinterpret_cast<const char*>(buffer.data()) << "]\n";
    }

    size_t currentPos = 0;
    if (!buffer[0]) {
        // RegistryEntry is an anonymous registry value
        os << '@';
        currentPos += 1;
    } else {
        // RegistryEntry is a named registry value
        currentPos += WriteEscaped(os, buffer.data());
    }

    // Now, the actual data follows. First we write the data prefix
    const auto& prefix = g_RegTypeMapping.at(type).prefix;
    os << prefix;
    currentPos += prefix.length();

    // The actual data format depends on the type
    if (type == REG_SZ) {
        const auto dataBegin = buffer.data() + buffer.size() - dataLen;
        WriteEscaped(os, dataBegin, false);
    } else if (type == REG_DWORD) {
        uint32_t val = 0;
        for (size_t i = buffer.size() - sizeof(uint32_t); i < buffer.size(); ++i) {
            val <<= 8;
            val += buffer[i];
        }
        os << std::hex << std::setw(8) << std::setfill('0') << val;
    } else {
        if (dataLen > 0) {
            // Windows always exports 25 pairs of hex bytes (delimited by a comma) on each line
            // including two characters at the start so we do the same.
            constexpr auto lineWrap = 25 * 3 + 1;
            auto dataIt = std::prev(buffer.cend(), dataLen);
            os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt++;
            for ( ; dataIt != buffer.cend(); dataIt++) {
                os << ',';
                currentPos++;
                if (currentPos >= lineWrap) {
                    os << "\\\n  ";
                    currentPos = 2;
                }
                os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt;
                currentPos += 2;
            }
        }
    }
    return os << '\n';
}